

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg,string *config,
          string *lang,cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  bool bVar1;
  __type _Var2;
  cmCompiledGeneratorExpression *pcVar3;
  string *psVar4;
  ulong uVar5;
  char *pcVar6;
  pointer ppVar7;
  ostream *poVar8;
  cmMakefile *this_00;
  mapped_type *this_01;
  undefined1 local_6a8 [8];
  cmGeneratedFileStream fout;
  undefined1 local_440 [8];
  ostringstream e_1;
  _Self local_2c8;
  _Self local_2c0;
  iterator it;
  string local_298;
  allocator local_271;
  undefined1 local_270 [8];
  string outputContent;
  undefined1 local_248 [8];
  string outputFileName;
  undefined1 local_208 [8];
  ostringstream e;
  allocator local_85 [13];
  undefined1 local_78 [8];
  string condResult;
  string rawCondition;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *outputFiles_local;
  cmCompiledGeneratorExpression *inputExpression_local;
  string *lang_local;
  string *config_local;
  cmLocalGenerator *lg_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  
  pcVar3 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&this->Condition);
  psVar4 = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(pcVar3);
  std::__cxx11::string::string((string *)(condResult.field_2._M_local_buf + 8),(string *)psVar4);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar3 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&this->Condition);
    pcVar6 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar3,lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,lang);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_78,pcVar6,local_85);
    std::allocator<char>::~allocator((allocator<char> *)local_85);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"0");
    if (bVar1) {
      bVar1 = true;
    }
    else {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,"1");
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        poVar8 = std::operator<<((ostream *)local_208,"Evaluation file condition \"");
        poVar8 = std::operator<<(poVar8,(string *)(condResult.field_2._M_local_buf + 8));
        poVar8 = std::operator<<(poVar8,"\" did not evaluate to valid content. Got \"");
        poVar8 = std::operator<<(poVar8,(string *)local_78);
        std::operator<<(poVar8,"\".");
        std::__cxx11::ostringstream::str();
        cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)((long)&outputFileName.field_2 + 8))
        ;
        std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
        bVar1 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      }
      else {
        bVar1 = false;
      }
    }
    std::__cxx11::string::~string((string *)local_78);
    if (bVar1) goto LAB_00727ad5;
  }
  pcVar3 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&this->OutputFileExpr);
  pcVar6 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar3,lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_248,pcVar6,(allocator *)(outputContent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(outputContent.field_2._M_local_buf + 0xf));
  pcVar6 = cmCompiledGeneratorExpression::Evaluate
                     (inputExpression,lg,config,false,(cmGeneratorTarget *)0x0,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_270,pcVar6,&local_271);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_248);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&local_298,(string *)local_248);
    std::__cxx11::string::operator=((string *)local_248,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
  }
  else {
    FixRelativePath((string *)&it,this,(string *)local_248,PathForOutput,lg);
    std::__cxx11::string::operator=((string *)local_248,(string *)&it);
    std::__cxx11::string::~string((string *)&it);
  }
  local_2c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(outputFiles,(key_type *)local_248);
  local_2c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(outputFiles);
  bVar1 = std::operator!=(&local_2c0,&local_2c8);
  if (bVar1) {
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_2c0);
    _Var2 = std::operator==(&ppVar7->second,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_270);
    if (!_Var2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
      poVar8 = std::operator<<((ostream *)local_440,
                               "Evaluation file to be written multiple times with different content. This is generally caused by the content evaluating the configuration type, language, or location of object files:\n "
                              );
      std::operator<<(poVar8,(string *)local_248);
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)&fout.field_0x240);
      std::__cxx11::string::~string((string *)&fout.field_0x240);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_440);
    }
  }
  else {
    this_00 = cmLocalGenerator::GetMakefile(lg);
    cmMakefile::AddCMakeOutputFile(this_00,(string *)local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,(value_type *)local_248);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](outputFiles,(key_type *)local_248);
    std::__cxx11::string::operator=((string *)this_01,(string *)local_270);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_6a8,pcVar6,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_6a8,true);
    std::operator<<((ostream *)local_6a8,(string *)local_270);
    bVar1 = cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_6a8);
    if ((bVar1) && (perm != 0)) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::SetPermissions(pcVar6,perm,false);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_6a8);
  }
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::~string((string *)local_248);
LAB_00727ad5:
  std::__cxx11::string::~string((string *)(condResult.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(
  cmLocalGenerator* lg, const std::string& config, const std::string& lang,
  cmCompiledGeneratorExpression* inputExpression,
  std::map<std::string, std::string>& outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  if (!rawCondition.empty()) {
    std::string condResult = this->Condition->Evaluate(
      lg, config, false, CM_NULLPTR, CM_NULLPTR, CM_NULLPTR, lang);
    if (condResult == "0") {
      return;
    }
    if (condResult != "1") {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition
        << "\" did "
           "not evaluate to valid content. Got \""
        << condResult << "\".";
      lg->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
    }
  }

  std::string outputFileName = this->OutputFileExpr->Evaluate(
    lg, config, false, CM_NULLPTR, CM_NULLPTR, CM_NULLPTR, lang);
  const std::string outputContent = inputExpression->Evaluate(
    lg, config, false, CM_NULLPTR, CM_NULLPTR, CM_NULLPTR, lang);

  if (cmSystemTools::FileIsFullPath(outputFileName)) {
    outputFileName = cmSystemTools::CollapseFullPath(outputFileName);
  } else {
    outputFileName = this->FixRelativePath(outputFileName, PathForOutput, lg);
  }

  std::map<std::string, std::string>::iterator it =
    outputFiles.find(outputFileName);

  if (it != outputFiles.end()) {
    if (it->second == outputContent) {
      return;
    }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times with different "
         "content. "
         "This is generally caused by the content evaluating the "
         "configuration type, language, or location of object files:\n "
      << outputFileName;
    lg->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  lg->GetMakefile()->AddCMakeOutputFile(outputFileName);
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  cmGeneratedFileStream fout(outputFileName.c_str());
  fout.SetCopyIfDifferent(true);
  fout << outputContent;
  if (fout.Close() && perm) {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
  }
}